

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O0

void __thiscall QAccessibleWidget::addControllingSignal(QAccessibleWidget *this,QString *signal)

{
  QLatin1StringView latin1;
  int iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  QList<QString> *this_00;
  qsizetype in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QByteArray s;
  rvalue_ref in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  int line;
  QByteArray *in_stack_ffffffffffffff48;
  QMessageLogger *in_stack_ffffffffffffff50;
  QLatin1String *this_01;
  long *plVar5;
  char local_58 [56];
  QLatin1String local_20;
  undefined1 *local_10;
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_20.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  plVar5 = in_RDI;
  QString::toLatin1(in_stack_ffffffffffffff38);
  QByteArray::operator_cast_to_char_((QByteArray *)0x7dd49c);
  QMetaObject::normalizedSignature((char *)&local_20);
  QByteArray::~QByteArray((QByteArray *)0x7dd4b9);
  puVar2 = (undefined8 *)(**(code **)(*in_RDI + 0x18))();
  pcVar3 = (char *)(**(code **)*puVar2)();
  QByteArray::operator_cast_to_char_((QByteArray *)0x7dd4de);
  iVar1 = QMetaObject::indexOfSignal(pcVar3);
  if (iVar1 < 0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,line,
               (char *)in_stack_ffffffffffffff38);
    pcVar3 = QByteArray::constData((QByteArray *)0x7dd51b);
    puVar2 = (undefined8 *)(**(code **)(*in_RDI + 0x18))();
    (**(code **)*puVar2)();
    uVar4 = QMetaObject::className();
    QMessageLogger::warning(local_58,"Signal %s unknown in %s",pcVar3,uVar4);
  }
  this_00 = (QList<QString> *)(in_RDI[3] + 0x20);
  this_01 = &local_20;
  QLatin1String::QLatin1String(this_01,in_stack_ffffffffffffff48);
  latin1.m_data = (char *)plVar5;
  latin1.m_size = in_RSI;
  QString::QString((QString *)this_01,latin1);
  QList<QString>::operator<<(this_00,in_stack_ffffffffffffff38);
  QString::~QString((QString *)0x7dd5b1);
  QByteArray::~QByteArray((QByteArray *)0x7dd5bb);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAccessibleWidget::addControllingSignal(const QString &signal)
{
    QByteArray s = QMetaObject::normalizedSignature(signal.toLatin1());
    if (Q_UNLIKELY(object()->metaObject()->indexOfSignal(s) < 0))
        qWarning("Signal %s unknown in %s", s.constData(), object()->metaObject()->className());
    d->primarySignals << QLatin1StringView(s);
}